

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_math_lang.cpp
# Opt level: O2

ReaderTablesPtr Omega_h::math_lang::ask_reader_tables(void)

{
  int iVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  ReaderTablesPtr RVar2;
  LanguagePtr lang;
  __shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2> local_30;
  Language *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  if (ask_reader_tables()::ptr == '\0') {
    iVar1 = __cxa_guard_acquire(&ask_reader_tables()::ptr);
    if (iVar1 != 0) {
      __cxa_atexit(std::__shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&ask_reader_tables::ptr,&__dso_handle);
      __cxa_guard_release(&ask_reader_tables()::ptr);
    }
  }
  if ((ask_reader_tables::ptr.
       super___shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
     ((ask_reader_tables::ptr.
       super___shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count == 0)) {
    ask_language();
    build_reader_tables((Omega_h *)&local_30,local_20);
    std::__shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&ask_reader_tables::ptr.
                super___shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2>,
               &local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  }
  std::__shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2> *)in_RDI,
             &ask_reader_tables::ptr.
              super___shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2>);
  RVar2.super___shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  RVar2.super___shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ReaderTablesPtr)
         RVar2.super___shared_ptr<const_Omega_h::ReaderTables,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ReaderTablesPtr ask_reader_tables() {
#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wexit-time-destructors"
#endif
  static ReaderTablesPtr ptr;
#ifdef __clang__
#pragma clang diagnostic pop
#endif
  if (ptr.use_count() == 0) {
    LanguagePtr lang = ask_language();
    ptr = build_reader_tables(*lang);
  }
  return ptr;
}